

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cpp_properties::decode_to_utf8<char_const*,char>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,cpp_properties *this,iterator_range<const_char_*> *code_point)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar6;
  undefined1 local_88 [8];
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  utf8_converter;
  ulong uVar5;
  
  lVar2 = 0;
  iVar6 = 0;
  do {
    bVar1 = *(byte *)(*(long *)this + 2 + lVar2);
    uVar4 = bVar1 - 0x30;
    uVar5 = (ulong)uVar4;
    if (uVar4 < 0x37) {
      iVar3 = (int)(char)bVar1;
      if ((0x3ffUL >> (uVar5 & 0x3f) & 1) == 0) {
        if ((0x7e0000UL >> (uVar5 & 0x3f) & 1) == 0) {
          if ((0x7e000000000000U >> (uVar5 & 0x3f) & 1) != 0) {
            iVar6 = iVar6 * 0x10 + iVar3 + -0x57;
          }
        }
        else {
          iVar6 = iVar6 * 0x10 + iVar3 + -0x37;
        }
      }
      else {
        iVar6 = iVar6 * 0x10 + iVar3 + -0x30;
      }
    }
    lVar2 = lVar2 + 1;
  } while ((int)lVar2 != 4);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                     *)local_88);
  utf8_converter._92_4_ = 0;
  utf8_converter._88_4_ = iVar6;
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::to_bytes(__return_storage_ptr__,
             (wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
              *)local_88,(wchar_t *)&utf8_converter._M_with_cvtstate,
             (wchar_t *)&utf8_converter.field_0x5c);
  std::__cxx11::
  wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
  ::~wstring_convert((wstring_convert<std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>,_wchar_t,_std::allocator<wchar_t>,_std::allocator<char>_>
                      *)local_88);
  return __return_storage_ptr__;
}

Assistant:

std::basic_string<CharT> decode_to_utf8(const boost::iterator_range<ForwardTraversalIterator> &code_point) {
  auto c = code_point.begin();
  // skip unicode escape sequence (\u)
  std::advance(c, 2);
  int value = 0;
  for (int i = 0; i < 4; i++) {
    char chr = *c++;
    switch (chr) {
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      value = (value << 4) + chr - '0';
      break;
    case 'a':
    case 'b':
    case 'c':
    case 'd':
    case 'e':
    case 'f':
      value = (value << 4) + 10 + chr - 'a';
      break;
    case 'A':
    case 'B':
    case 'C':
    case 'D':
    case 'E':
    case 'F':
      value = (value << 4) + 10 + chr - 'A';
      break;
    }
  }

  typedef std::codecvt_utf8<wchar_t> convert_typeX;
  std::wstring_convert<convert_typeX, wchar_t> utf8_converter;

  return utf8_converter.to_bytes(std::char_traits<wchar_t>::to_char_type(value));
}